

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O2

int done_testing(void)

{
  indent();
  printf("1..%d\n",(ulong)(uint)cur_tests->num_tests);
  fflush(_stdout);
  return cur_tests->failed;
}

Assistant:

int done_testing(void)
{
    indent();
    printf("1..%d\n", cur_tests->num_tests);
    fflush(stdout);
    return cur_tests->failed;
}